

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void CalcWindowContentSizes
               (ImGuiWindow *window,ImVec2 *content_size_current,ImVec2 *content_size_ideal)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  undefined1 auVar4 [16];
  
  if ((((window->Collapsed != true) || ('\0' < window->AutoFitFramesX)) ||
      ('\0' < window->AutoFitFramesY)) &&
     (((window->Hidden != true || (window->HiddenFramesCannotSkipItems != '\0')) ||
      (window->HiddenFramesCanSkipItems < '\x01')))) {
    fVar3 = (window->ContentSizeExplicit).x;
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      auVar1 = vcvtdq2ps_avx(ZEXT416((uint)(int)((window->DC).CursorMaxPos.x -
                                                (window->DC).CursorStartPos.x)));
      fVar3 = auVar1._0_4_;
    }
    content_size_current->x = fVar3;
    fVar3 = (window->ContentSizeExplicit).y;
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      auVar1 = vcvtdq2ps_avx(ZEXT416((uint)(int)((window->DC).CursorMaxPos.y -
                                                (window->DC).CursorStartPos.y)));
      fVar3 = auVar1._0_4_;
    }
    content_size_current->y = fVar3;
    fVar3 = (window->ContentSizeExplicit).x;
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      auVar2 = ZEXT416((uint)(window->DC).CursorMaxPos.x);
      auVar4 = ZEXT416((uint)(window->DC).IdealMaxPos.x);
      auVar1 = vcmpss_avx(auVar4,auVar2,2);
      auVar1 = vblendvps_avx(auVar4,auVar2,auVar1);
      auVar1 = vcvtdq2ps_avx(ZEXT416((uint)(int)(auVar1._0_4_ - (window->DC).CursorStartPos.x)));
      fVar3 = auVar1._0_4_;
    }
    content_size_ideal->x = fVar3;
    fVar3 = (window->ContentSizeExplicit).y;
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      auVar2 = ZEXT416((uint)(window->DC).CursorMaxPos.y);
      auVar4 = ZEXT416((uint)(window->DC).IdealMaxPos.y);
      auVar1 = vcmpss_avx(auVar4,auVar2,2);
      auVar1 = vblendvps_avx(auVar4,auVar2,auVar1);
      auVar1 = vcvtdq2ps_avx(ZEXT416((uint)(int)(auVar1._0_4_ - (window->DC).CursorStartPos.y)));
      fVar3 = auVar1._0_4_;
    }
    content_size_ideal->y = fVar3;
    return;
  }
  *content_size_current = window->ContentSize;
  *content_size_ideal = window->ContentSizeIdeal;
  return;
}

Assistant:

static void CalcWindowContentSizes(ImGuiWindow* window, ImVec2* content_size_current, ImVec2* content_size_ideal)
{
    bool preserve_old_content_sizes = false;
    if (window->Collapsed && window->AutoFitFramesX <= 0 && window->AutoFitFramesY <= 0)
        preserve_old_content_sizes = true;
    else if (window->Hidden && window->HiddenFramesCannotSkipItems == 0 && window->HiddenFramesCanSkipItems > 0)
        preserve_old_content_sizes = true;
    if (preserve_old_content_sizes)
    {
        *content_size_current = window->ContentSize;
        *content_size_ideal = window->ContentSizeIdeal;
        return;
    }

    content_size_current->x = (window->ContentSizeExplicit.x != 0.0f) ? window->ContentSizeExplicit.x : IM_FLOOR(window->DC.CursorMaxPos.x - window->DC.CursorStartPos.x);
    content_size_current->y = (window->ContentSizeExplicit.y != 0.0f) ? window->ContentSizeExplicit.y : IM_FLOOR(window->DC.CursorMaxPos.y - window->DC.CursorStartPos.y);
    content_size_ideal->x = (window->ContentSizeExplicit.x != 0.0f) ? window->ContentSizeExplicit.x : IM_FLOOR(ImMax(window->DC.CursorMaxPos.x, window->DC.IdealMaxPos.x) - window->DC.CursorStartPos.x);
    content_size_ideal->y = (window->ContentSizeExplicit.y != 0.0f) ? window->ContentSizeExplicit.y : IM_FLOOR(ImMax(window->DC.CursorMaxPos.y, window->DC.IdealMaxPos.y) - window->DC.CursorStartPos.y);
}